

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void __thiscall CDevice::CDevice(CDevice *this,char *name,CDevice *parent)

{
  char *pcVar1;
  CDevicePage **page;
  CDevicePage **__end1_1;
  CDevicePage **__begin1_1;
  CDevicePage *(*__range1_1) [1024];
  CDeviceSlot **slot;
  CDeviceSlot **__end1;
  CDeviceSlot **__begin1;
  CDeviceSlot *(*__range1) [256];
  CDevice *parent_local;
  char *name_local;
  CDevice *this_local;
  
  this->Next = (CDevice *)0x0;
  this->SlotsCount = 0;
  this->PagesCount = 0;
  this->Memory = (byte *)0x0;
  this->ZxRamTop = 0;
  this->CurrentSlot = 0;
  this->previousSlotI = 0;
  this->previousSlotOpt = O_NONE;
  this->limitExceeded = false;
  pcVar1 = strdup(name);
  this->ID = pcVar1;
  if (parent != (CDevice *)0x0) {
    parent->Next = this;
  }
  for (__end1 = this->Slots; __end1 != (CDeviceSlot **)this->Pages; __end1 = __end1 + 1) {
    *__end1 = (CDeviceSlot *)0x0;
  }
  for (__end1_1 = this->Pages; __end1_1 != (CDevicePage **)&this->previousSlotI;
      __end1_1 = __end1_1 + 1) {
    *__end1_1 = (CDevicePage *)0x0;
  }
  return;
}

Assistant:

CDevice::CDevice(const char *name, CDevice *parent)
	: Next(nullptr), SlotsCount(0), PagesCount(0), Memory(nullptr), ZxRamTop(0), CurrentSlot(0),
	previousSlotI(0), previousSlotOpt(CDeviceSlot::ESlotOptions::O_NONE), limitExceeded(false) {
	ID = STRDUP(name);
	if (parent) parent->Next = this;
	for (auto & slot : Slots) slot = nullptr;
	for (auto & page : Pages) page = nullptr;
}